

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::printDebugDelimiterLocation(PrintSExpression *this,Expression *curr,Index i)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  void *pvVar4;
  uint *puVar5;
  ZeroInitSmallVector<unsigned_int,_1UL> *locations;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
  local_28;
  iterator iter;
  Expression *pEStack_18;
  Index i_local;
  Expression *curr_local;
  PrintSExpression *this_local;
  
  if ((this->currFunction != (Function *)0x0) && ((this->debugInfo & 1U) != 0)) {
    iter.
    super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
    ._M_cur._4_4_ = i;
    pEStack_18 = curr;
    curr_local = (Expression *)this;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
         ::find(&this->currFunction->delimiterLocations,&stack0xffffffffffffffe8);
    locations = (ZeroInitSmallVector<unsigned_int,_1UL> *)
                std::
                unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
                ::end(&this->currFunction->delimiterLocations);
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                        *)&locations);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
                             *)&local_28);
      Colors::grey(this->o);
      poVar3 = std::operator<<(this->o,";; code offset: 0x");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      puVar5 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                         (&ppVar2->second,
                          (ulong)iter.
                                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                                 ._M_cur._4_4_);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,*puVar5);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::dec);
      std::operator<<(poVar3,'\n');
      restoreNormalColor(this->o);
      doIndent(this->o,this->indent);
    }
  }
  return;
}

Assistant:

void printDebugDelimiterLocation(Expression* curr, Index i) {
    if (currFunction && debugInfo) {
      auto iter = currFunction->delimiterLocations.find(curr);
      if (iter != currFunction->delimiterLocations.end()) {
        auto& locations = iter->second;
        Colors::grey(o);
        o << ";; code offset: 0x" << std::hex << locations[i] << std::dec
          << '\n';
        restoreNormalColor(o);
        doIndent(o, indent);
      }
    }
  }